

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImFontAtlas::GetTexDataAsRGBA32
          (ImFontAtlas *this,uchar **out_pixels,int *out_width,int *out_height,
          int *out_bytes_per_pixel)

{
  int iVar1;
  void *pvVar2;
  int *in_RCX;
  int *in_RDX;
  undefined8 *in_RSI;
  int *in_RDI;
  undefined4 *in_R8;
  int n;
  uint *dst;
  uchar *src;
  uchar *pixels;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int *in_stack_ffffffffffffffc0;
  uint *puVar3;
  uchar **in_stack_ffffffffffffffc8;
  byte *pbVar4;
  
  if (*(long *)(in_RDI + 8) == 0) {
    pbVar4 = (byte *)0x0;
    GetTexDataAsAlpha8((ImFontAtlas *)0x0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                       (int *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),in_RDI);
    if (pbVar4 != (byte *)0x0) {
      pvVar2 = ImGui::MemAlloc((size_t)in_RDI);
      *(void **)(in_RDI + 8) = pvVar2;
      puVar3 = *(uint **)(in_RDI + 8);
      for (iVar1 = in_RDI[10] * in_RDI[0xb]; 0 < iVar1; iVar1 = iVar1 + -1) {
        *puVar3 = (uint)*pbVar4 << 0x18 | 0xffffff;
        puVar3 = puVar3 + 1;
        pbVar4 = pbVar4 + 1;
      }
    }
  }
  *in_RSI = *(undefined8 *)(in_RDI + 8);
  if (in_RDX != (int *)0x0) {
    *in_RDX = in_RDI[10];
  }
  if (in_RCX != (int *)0x0) {
    *in_RCX = in_RDI[0xb];
  }
  if (in_R8 != (undefined4 *)0x0) {
    *in_R8 = 4;
  }
  return;
}

Assistant:

void    ImFontAtlas::GetTexDataAsRGBA32(unsigned char** out_pixels, int* out_width, int* out_height, int* out_bytes_per_pixel)
{
    // Convert to RGBA32 format on demand
    // Although it is likely to be the most commonly used format, our font rendering is 1 channel / 8 bpp
    if (!TexPixelsRGBA32)
    {
        unsigned char* pixels = NULL;
        GetTexDataAsAlpha8(&pixels, NULL, NULL);
        if (pixels)
        {
            TexPixelsRGBA32 = (unsigned int*)IM_ALLOC((size_t)TexWidth * (size_t)TexHeight * 4);
            const unsigned char* src = pixels;
            unsigned int* dst = TexPixelsRGBA32;
            for (int n = TexWidth * TexHeight; n > 0; n--)
                *dst++ = IM_COL32(255, 255, 255, (unsigned int)(*src++));
        }
    }

    *out_pixels = (unsigned char*)TexPixelsRGBA32;
    if (out_width) *out_width = TexWidth;
    if (out_height) *out_height = TexHeight;
    if (out_bytes_per_pixel) *out_bytes_per_pixel = 4;
}